

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  ConstantID const_id;
  uint32_t uVar1;
  uint32_t id;
  TypeID type_id;
  uint32_t *puVar2;
  uint *puVar3;
  bool bVar4;
  SPIRConstantOp *pSVar5;
  CompilerGLSL *this_00;
  ulong uVar6;
  bool bVar7;
  ConstantID const_id_00;
  int iVar8;
  SPIRType *type;
  SPIRType *pSVar9;
  long *plVar10;
  ulong uVar11;
  mapped_type *initializers;
  runtime_error *prVar12;
  bool bVar13;
  char *pcVar14;
  Constant *pCVar15;
  uint uVar16;
  uint uVar17;
  BaseType BVar18;
  undefined *puVar19;
  TypedID<(spirv_cross::Types)3> *pTVar20;
  char (*in_R9) [2];
  ConstantID const_id_01;
  ulong uVar21;
  BaseType input_type;
  TypeID local_24c;
  string local_248;
  SPIRConstantOp *local_228;
  CompilerGLSL *local_220;
  string op;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> new_init;
  string right_arg;
  SPIRConstant tmp_const;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  uVar16 = 0x81;
  if ((this->options).es != false) {
    uVar16 = 299;
  }
  iVar8 = *(int *)&(cop->super_IVariant).field_0xc;
  if (((this->options).version <= uVar16) &&
     (((iVar8 - 0x6dU < 0x40 && ((0x8000040012000019U >> ((ulong)(iVar8 - 0x6dU) & 0x3f) & 1) != 0))
      || ((iVar8 - 0xaeU < 0x15 && ((0x100015U >> (iVar8 - 0xaeU & 0x1f) & 1) != 0)))))) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar12,"Unsigned integers are not supported on legacy targets.");
    goto LAB_002cefcd;
  }
  if (iVar8 < 0x7e) {
    if (0x70 < iVar8) {
      if (iVar8 - 0x71U < 3) {
        type_to_glsl_constructor_abi_cxx11_((string *)&tmp_const,this,type);
        ::std::__cxx11::string::operator=((string *)&op,(string *)&tmp_const);
        if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant != &tmp_const.m) {
          operator_delete(tmp_const.super_IVariant._vptr_IVariant);
        }
        goto LAB_002cee5b;
      }
      goto switchD_002ce0c8_caseD_7f;
    }
    local_228 = cop;
    if (iVar8 == 0x4f) {
      type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pSVar9 = Compiler::expression_type
                         (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr
                         );
      uVar16 = pSVar9->vecsize;
      to_enclosed_expression_abi_cxx11_
                ((string *)&new_init,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true)
      ;
      to_enclosed_expression_abi_cxx11_
                (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
      if (2 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
        uVar21 = 2;
        do {
          uVar17 = (cop->arguments).super_VectorView<unsigned_int>.ptr[uVar21];
          if (uVar17 == 0xffffffff) {
            SPIRConstant::SPIRConstant(&tmp_const);
            cop = local_228;
            uVar1 = (type->parent_type).id;
            tmp_const.super_IVariant._12_4_ = uVar1;
            if (uVar1 == 0) {
              __assert_fail("type.parent_type != ID(0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                            ,0x1676,
                            "virtual string spirv_cross::CompilerGLSL::constant_op_expression(const SPIRConstantOp &)"
                           );
            }
            constant_expression_abi_cxx11_(&local_248,this,&tmp_const,false,false);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_248._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p);
            }
            tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_004908b0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmp_const.specialization_constant_macro_name._M_dataplus._M_p !=
                &tmp_const.specialization_constant_macro_name.field_2) {
              operator_delete(tmp_const.specialization_constant_macro_name._M_dataplus._M_p);
            }
            tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
                tmp_const.subconstants.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
                &tmp_const.subconstants.stack_storage) {
              free(tmp_const.subconstants.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr);
            }
          }
          else {
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            if (uVar17 < uVar16) {
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_248,
                         new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                         ,(long)&(new_init.
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                                 )->id +
                          new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
                          buffer_size);
              ::std::__cxx11::string::append((char *)&local_248);
              plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                          ((ulong)&local_248,local_248._M_string_length,0,'\x01');
              cop = local_228;
              tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&tmp_const.m;
              pCVar15 = (Constant *)(plVar10 + 2);
              if ((Constant *)*plVar10 == pCVar15) {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.m.c[0].r[1] = *(Constant *)(plVar10 + 3);
              }
              else {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.super_IVariant._vptr_IVariant = (_func_int **)*plVar10;
              }
              tmp_const.super_IVariant._8_8_ = plVar10[1];
              *plVar10 = (long)pCVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,
                         (ulong)tmp_const.super_IVariant._vptr_IVariant);
              if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant != &tmp_const.m) {
                operator_delete(tmp_const.super_IVariant._vptr_IVariant);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
LAB_002ce64a:
                operator_delete(local_248._M_dataplus._M_p);
              }
            }
            else {
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_248,right_arg._M_dataplus._M_p,
                         right_arg._M_dataplus._M_p + right_arg._M_string_length);
              ::std::__cxx11::string::append((char *)&local_248);
              plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                          ((ulong)&local_248,local_248._M_string_length,0,'\x01');
              cop = local_228;
              tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&tmp_const.m;
              pCVar15 = (Constant *)(plVar10 + 2);
              if ((Constant *)*plVar10 == pCVar15) {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.m.c[0].r[1] = *(Constant *)(plVar10 + 3);
              }
              else {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.super_IVariant._vptr_IVariant = (_func_int **)*plVar10;
              }
              tmp_const.super_IVariant._8_8_ = plVar10[1];
              *plVar10 = (long)pCVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,
                         (ulong)tmp_const.super_IVariant._vptr_IVariant);
              if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant != &tmp_const.m) {
                operator_delete(tmp_const.super_IVariant._vptr_IVariant);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) goto LAB_002ce64a;
            }
          }
          uVar21 = uVar21 + 1;
          uVar11 = (ulong)(uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size;
          if (uVar21 < uVar11) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar11 = (ulong)(uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size;
          }
        } while (uVar21 < uVar11);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
        operator_delete(right_arg._M_dataplus._M_p);
      }
      pTVar20 = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
      if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr ==
          (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) goto LAB_002cedf6;
      goto LAB_002cedf1;
    }
    if (iVar8 == 0x51) {
      puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      access_chain_internal_abi_cxx11_
                (__return_storage_ptr__,this,*puVar2,puVar2 + 1,
                 (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                 (AccessChainMeta *)0x0);
      goto LAB_002cedf6;
    }
    if (iVar8 != 0x52) goto switchD_002ce0c8_caseD_7f;
    get_composite_constant_ids
              (&new_init,this,(ConstantID)(cop->arguments).super_VectorView<unsigned_int>.ptr[1]);
    const_id_00.id = (cop->super_IVariant).self.id;
    local_24c.id = (cop->basetype).id;
    uVar21 = 2;
    local_220 = this;
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size - 4 < 0xfffffffffffffffd) {
      uVar11 = uVar21;
      uVar6 = 3;
      const_id_01.id = const_id_00.id;
      do {
        uVar21 = uVar6;
        const_id_00.id = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
        uVar16 = (local_228->arguments).super_VectorView<unsigned_int>.ptr[uVar11];
        const_id.id = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                      [uVar16].id;
        new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[uVar16].id =
             const_id_00.id;
        set_composite_constant(this,const_id_01,local_24c,&new_init);
        get_composite_constant_ids
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const,this,
                   const_id);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
                  (&new_init,
                   (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const);
        tmp_const.super_IVariant.self.id = 0;
        tmp_const.super_IVariant._12_4_ = 0;
        if ((Constant *)tmp_const.super_IVariant._vptr_IVariant != tmp_const.m.c[0].r + 1) {
          free(tmp_const.super_IVariant._vptr_IVariant);
        }
        pSVar5 = local_228;
        local_24c = get_composite_member_type
                              (local_220,local_24c,
                               (local_228->arguments).super_VectorView<unsigned_int>.ptr[uVar11]);
        uVar11 = uVar21;
        uVar6 = (ulong)((int)uVar21 + 1);
        const_id_01.id = const_id_00.id;
      } while (uVar21 < (pSVar5->arguments).super_VectorView<unsigned_int>.buffer_size - 1);
    }
    this_00 = local_220;
    pSVar5 = local_228;
    puVar3 = (local_228->arguments).super_VectorView<unsigned_int>.ptr;
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[puVar3[uVar21]].id =
         *puVar3;
    set_composite_constant(local_220,const_id_00,local_24c,&new_init);
    SPIRConstant::SPIRConstant(&tmp_const,(pSVar5->basetype).id);
    type_id.id = (pSVar5->basetype).id;
    right_arg._M_dataplus._M_p._0_4_ = (pSVar5->super_IVariant).self.id;
    initializers = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this_00->const_composite_insert_ids,(key_type *)&right_arg);
    fill_composite_constant(this_00,&tmp_const,type_id,initializers);
    constant_expression_abi_cxx11_(__return_storage_ptr__,this_00,&tmp_const,false,false);
    tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_004908b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tmp_const.specialization_constant_macro_name._M_dataplus._M_p !=
        &tmp_const.specialization_constant_macro_name.field_2) {
      operator_delete(tmp_const.specialization_constant_macro_name._M_dataplus._M_p);
    }
    tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
    buffer_size = 0;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
        tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
        &tmp_const.subconstants.stack_storage) {
      free(tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
          );
    }
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size = 0;
    tmp_const.m.c[0].r[2] =
         (Constant)new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
        new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr ==
        &new_init.stack_storage) goto LAB_002cedf6;
    goto LAB_002cef85;
  }
  switch(iVar8) {
  case 0x7e:
    pcVar14 = "-";
    goto LAB_002cee84;
  default:
switchD_002ce0c8_caseD_7f:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar12,"Unimplemented spec constant op.");
LAB_002cefcd:
    *(undefined ***)prVar12 = &PTR__runtime_error_0048ff00;
    __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    pcVar14 = "+";
    break;
  case 0x82:
    pcVar14 = "-";
    break;
  case 0x84:
    pcVar14 = "*";
    break;
  case 0x86:
  case 0x87:
    pcVar14 = "/";
    break;
  case 0x89:
  case 0x8b:
    pcVar14 = "%";
    break;
  case 0x8a:
    puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    uVar1 = *puVar2;
    id = puVar2[1];
    to_enclosed_expression_abi_cxx11_((string *)&tmp_const,this,uVar1,true);
    to_enclosed_expression_abi_cxx11_((string *)&new_init,this,id,true);
    to_enclosed_expression_abi_cxx11_(&right_arg,this,uVar1,true);
    to_enclosed_expression_abi_cxx11_(&local_248,this,id,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x384661,
               (char (*) [4])&new_init,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x397f10,
               (char (*) [4])0x398789,(char (*) [2])&right_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394bc3,
               (char (*) [4])&local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,
               (char (*) [2])__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
        (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) {
      operator_delete(new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr);
    }
    pTVar20 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_002cedf6;
    goto LAB_002cedf1;
  case 0xa4:
  case 0xaa:
    pcVar14 = "==";
    break;
  case 0xa5:
  case 0xab:
    pcVar14 = "!=";
    break;
  case 0xa6:
    pcVar14 = "||";
    break;
  case 0xa7:
    pcVar14 = "&&";
    break;
  case 0xa8:
    pcVar14 = "!";
    goto LAB_002cee84;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar12,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_002cefcd;
    }
    puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar3;
    bVar7 = to_trivial_mix_op(this,type,&op,puVar3[2],puVar3[1],*puVar3);
    if (!bVar7) {
      puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_(__return_storage_ptr__,this,type,*puVar2,puVar2[1],puVar2[2])
      ;
      goto LAB_002cedf6;
    }
LAB_002cee5b:
    iVar8 = *(int *)&(cop->super_IVariant).field_0xc;
    uVar16 = 0xfffffff8;
    bVar7 = false;
    bVar4 = false;
    bVar13 = false;
    if (iVar8 - 0x71U < 2) goto LAB_002ce860;
    goto LAB_002ce878;
  case 0xac:
  case 0xad:
    pcVar14 = ">";
    break;
  case 0xae:
  case 0xaf:
    pcVar14 = ">=";
    break;
  case 0xb0:
  case 0xb1:
    pcVar14 = "<";
    break;
  case 0xb2:
  case 0xb3:
    pcVar14 = "<=";
    break;
  case 0xc2:
  case 0xc3:
    pcVar14 = ">>";
    break;
  case 0xc4:
    pcVar14 = "<<";
    break;
  case 0xc5:
    pcVar14 = "|";
    break;
  case 0xc6:
    pcVar14 = "^";
    break;
  case 199:
    pcVar14 = "&";
    break;
  case 200:
    pcVar14 = "~";
LAB_002cee84:
    bVar7 = false;
    ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar14);
    bVar13 = true;
    goto LAB_002ce860;
  }
  ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar14);
  bVar7 = true;
  bVar13 = false;
LAB_002ce860:
  bVar4 = bVar13;
  pSVar9 = Compiler::expression_type
                     (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
  iVar8 = *(int *)&(cop->super_IVariant).field_0xc;
  uVar16 = pSVar9->width - 8;
LAB_002ce878:
  bVar13 = true;
  if (((0x2b < iVar8 - 0x80U) || ((0xc0000000015U >> ((ulong)(iVar8 - 0x80U) & 0x3f) & 1) == 0)) &&
     (3 < iVar8 - 0xc4U)) {
    bVar13 = false;
  }
  if (iVar8 < 0xaa) {
    if (iVar8 < 0x86) {
      if (iVar8 == 0x71) {
switchD_002ce934_caseD_86:
        uVar17 = uVar16 << 0x1d | uVar16 >> 3;
        if ((7 < uVar17) || ((0x8bU >> (uVar16 >> 3 & 0x1f) & 1) == 0)) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar12,"Invalid bit width.");
          goto LAB_002cf0c4;
        }
        puVar19 = &DAT_003865a0;
        goto LAB_002ce991;
      }
      if ((iVar8 == 0x72) || (iVar8 == 0x7e)) goto switchD_002ce934_caseD_87;
    }
    else {
      switch(iVar8) {
      case 0x86:
      case 0x89:
        goto switchD_002ce934_caseD_86;
      case 0x87:
      case 0x8b:
switchD_002ce934_caseD_87:
        uVar17 = uVar16 << 0x1d | uVar16 >> 3;
        if ((7 < uVar17) || ((0x8bU >> (uVar16 >> 3 & 0x1f) & 1) == 0)) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar12,"Invalid bit width.");
          goto LAB_002cf0c4;
        }
        goto LAB_002ce963;
      }
    }
switchD_002ce934_caseD_88:
    BVar18 = type->basetype;
  }
  else {
    uVar17 = iVar8 - 0xaa;
    if (0x19 < uVar17) goto switchD_002ce934_caseD_88;
    if ((0x1000154U >> (uVar17 & 0x1f) & 1) != 0) goto switchD_002ce934_caseD_86;
    if ((0x20002a8U >> (uVar17 & 0x1f) & 1) != 0) goto switchD_002ce934_caseD_87;
    if ((3U >> (uVar17 & 0x1f) & 1) == 0) goto switchD_002ce934_caseD_88;
    uVar17 = uVar16 << 0x1d | uVar16 >> 3;
    if ((7 < uVar17) || ((0x8bU >> (uVar16 >> 3 & 0x1f) & 1) == 0)) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar12,"Invalid bit width.");
      goto LAB_002cf0c4;
    }
LAB_002ce963:
    puVar19 = &DAT_00386580;
LAB_002ce991:
    BVar18 = *(BaseType *)(puVar19 + (ulong)uVar17 * 4);
  }
  input_type = BVar18;
  if (bVar7) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar12,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_002cf0c4;
    }
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size = 0;
    new_init.buffer_capacity._0_1_ = 0;
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
         (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity;
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    binary_op_bitcast_helper
              ((SPIRType *)&tmp_const,this,(string *)&new_init,&right_arg,&input_type,*puVar2,
               puVar2[1],bVar13);
    if (type->basetype == Boolean || type->basetype == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x398789,(char (*) [2])&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a6d9,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a6d9,
                 (char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,
                 (char (*) [2])__return_storage_ptr__);
    }
    else {
      tmp_const.m.c[0].r[0].u32 = input_type;
      (*(this->super_Compiler)._vptr_Compiler[0x3c])(__return_storage_ptr__,this,type);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_248,(spirv_cross *)&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a6d9,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a6d9,
                 (char (*) [2])&right_arg,__return_storage_ptr__);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0048ff28;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&tmp_const.subconstants.stack_storage);
    tmp_const.m.c[3].id[0].id = 0;
    tmp_const.m.c[3].id[1].id = 0;
    if ((uint32_t *)tmp_const.m.c[3].r[3].u64 != &tmp_const.m.c[3].vecsize) {
      free((void *)tmp_const.m.c[3].r[3]);
    }
    tmp_const.m.c[2].id[0].id = 0;
    tmp_const.m.c[2].id[1].id = 0;
    if ((uint32_t *)tmp_const.m.c[2].r[3].u64 != &tmp_const.m.c[2].vecsize) {
      free((void *)tmp_const.m.c[2].r[3]);
    }
    tmp_const.m.c[1].r[3].u64 = 0;
    if ((ID *)tmp_const.m.c[1].r[2].u64 != tmp_const.m.c[1].id + 2) {
      free((void *)tmp_const.m.c[1].r[2]);
    }
    tmp_const.m.c[0].r[3].u64 = 0;
    if ((ID *)tmp_const.m.c[0].r[2].u64 != tmp_const.m.c[0].id + 2) {
      free((void *)tmp_const.m.c[0].r[2]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    pTVar20 = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
    if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr ==
        (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) goto LAB_002cedf6;
  }
  else if (bVar4) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar12,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_002cf0c4;
    }
    bitcast_glsl_abi_cxx11_
              ((string *)&tmp_const,this,type,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x398789,(char (*) [2])&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,in_R9);
    pTVar20 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_002cedf6;
  }
  else if (iVar8 - 0x71U < 2) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar12,"Not enough arguments to OpSpecConstantOp.");
LAB_002cf0c4:
      *(undefined ***)prVar12 = &PTR__runtime_error_0048ff00;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar9 = Compiler::expression_type
                       (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    if ((pSVar9->width < type->width) && (BVar18 != pSVar9->basetype)) {
      SPIRType::SPIRType((SPIRType *)&tmp_const,pSVar9);
      tmp_const.m.c[0].r[0].u32 = BVar18;
      bitcast_glsl_abi_cxx11_
                ((string *)&new_init,this,(SPIRType *)&tmp_const,
                 *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398789,
                 (char (*) [2])&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,in_R9
                );
      if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
          (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) {
        operator_delete(new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr)
        ;
      }
      tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0048ff28;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&tmp_const.subconstants.stack_storage);
      tmp_const.m.c[3].id[0].id = 0;
      tmp_const.m.c[3].id[1].id = 0;
      if ((uint32_t *)tmp_const.m.c[3].r[3].u64 != &tmp_const.m.c[3].vecsize) {
        free((void *)tmp_const.m.c[3].r[3]);
      }
      tmp_const.m.c[2].id[0].id = 0;
      tmp_const.m.c[2].id[1].id = 0;
      if ((uint32_t *)tmp_const.m.c[2].r[3].u64 != &tmp_const.m.c[2].vecsize) {
        free((void *)tmp_const.m.c[2].r[3]);
      }
      tmp_const.m.c[1].r[3].u64 = 0;
      if ((ID *)tmp_const.m.c[1].r[2].u64 != tmp_const.m.c[1].id + 2) {
        free((void *)tmp_const.m.c[1].r[2]);
      }
      tmp_const.m.c[0].r[3].u64 = 0;
      if ((ID *)tmp_const.m.c[0].r[2].u64 != tmp_const.m.c[0].id + 2) {
LAB_002cef85:
        free((void *)tmp_const.m.c[0].r[2]);
      }
      goto LAB_002cedf6;
    }
    to_expression_abi_cxx11_
              ((string *)&tmp_const,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398789,
               (char (*) [2])&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,in_R9);
    pTVar20 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_002cedf6;
  }
  else {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar12,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_002cf0c4;
    }
    to_expression_abi_cxx11_
              ((string *)&tmp_const,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398789,
               (char (*) [2])&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,in_R9);
    pTVar20 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_002cedf6;
  }
LAB_002cedf1:
  operator_delete(pTVar20);
LAB_002cedf6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index == 0xFFFFFFFF)
			{
				SPIRConstant c;
				c.constant_type = type.parent_type;
				assert(type.parent_type != ID(0));
				expr += constant_expression(c);
			}
			else if (index >= left_components)
			{
				expr += right_arg + "." + "xyzw"[index - left_components];
			}
			else
			{
				expr += left_arg + "." + "xyzw"[index];
			}

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
	{
		SmallVector<ConstantID> new_init = get_composite_constant_ids(cop.arguments[1]);
		uint32_t idx;
		uint32_t target_id = cop.self;
		uint32_t target_type_id = cop.basetype;
		// We have to drill down to the part we want to modify, and create new
		// constants for each containing part.
		for (idx = 2; idx < cop.arguments.size() - 1; ++idx)
		{
			uint32_t new_const = ir.increase_bound_by(1);
			uint32_t old_const = new_init[cop.arguments[idx]];
			new_init[cop.arguments[idx]] = new_const;
			set_composite_constant(target_id, target_type_id, new_init);
			new_init = get_composite_constant_ids(old_const);
			target_id = new_const;
			target_type_id = get_composite_member_type(target_type_id, cop.arguments[idx]);
		}
		// Now replace the initializer with the one from this instruction.
		new_init[cop.arguments[idx]] = cop.arguments[0];
		set_composite_constant(target_id, target_type_id, new_init);
		SPIRConstant tmp_const(cop.basetype);
		fill_composite_constant(tmp_const, cop.basetype, const_composite_insert_ids[cop.self]);
		return constant_expression(tmp_const);
	}

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}